

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,FunctionBody *func_body,void *data)

{
  bool bVar1;
  Function *this_00;
  pointer pSVar2;
  int *in_RDX;
  long in_RSI;
  CodeGenerateVisitor *in_RDI;
  Instruction i;
  Function *function_2;
  int end_register;
  int register_id;
  ExpVarData_conflict *exp_var_data;
  Function *function_1;
  String *self;
  int register_id_1;
  Guard g_1;
  Function *function;
  Guard g;
  int child_index;
  Function *in_stack_fffffffffffffe68;
  String *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  function<void_()> *in_stack_fffffffffffffe80;
  State *this_01;
  function<void_()> *in_stack_fffffffffffffe88;
  function<void_()> *enter;
  Guard *in_stack_fffffffffffffe90;
  CodeGenerateVisitor *this_02;
  undefined4 in_stack_fffffffffffffef4;
  undefined8 in_stack_fffffffffffffef8;
  CodeGenerateVisitor *in_stack_ffffffffffffff00;
  State local_e8;
  CodeGenerateVisitor local_60 [2];
  int local_1c;
  int *local_18;
  long local_10;
  
  local_1c = 0;
  this_02 = local_60;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::FunctionBody*,void*)::__0,void>
            (in_stack_fffffffffffffe80,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::FunctionBody*,void*)::__1,void>
            (in_stack_fffffffffffffe80,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Guard::Guard(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::function<void_()>::~function((function<void_()> *)0x1a3326);
  std::function<void_()>::~function((function<void_()> *)0x1a3333);
  this_00 = GetCurrentFunction(in_RDI);
  local_e8.stack_.top_ = (Value *)this_00;
  Function::SetLine(this_00,*(int *)(local_10 + 0x1c));
  local_1c = in_RDI->current_function_->func_index_;
  this_01 = &local_e8;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::FunctionBody*,void*)::__2,void>
            ((function<void_()> *)this_01,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  enter = (function<void_()> *)&stack0xfffffffffffffef0;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::Visit(luna::FunctionBody*,void*)::__3,void>
            ((function<void_()> *)this_01,
             (anon_class_8_1_8991fb9c *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Guard::Guard((Guard *)this_00,enter,(function<void_()> *)this_01);
  std::function<void_()>::~function((function<void_()> *)0x1a33ed);
  std::function<void_()>::~function((function<void_()> *)0x1a33fa);
  if ((*(byte *)(local_10 + 0x18) & 1) != 0) {
    in_stack_fffffffffffffe7c = GenerateRegisterId(this_02);
    in_stack_fffffffffffffe70 =
         State::GetString(this_01,(char *)CONCAT44(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78));
    InsertName(in_stack_ffffffffffffff00,(String *)in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef4);
    in_stack_fffffffffffffe68 = GetCurrentFunction(in_RDI);
    Function::AddFixedArgCount(in_stack_fffffffffffffe68,1);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a3544);
  if (bVar1) {
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x1a355b);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  }
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1a3585);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  Guard::~Guard((Guard *)in_stack_fffffffffffffe70);
  Guard::~Guard((Guard *)in_stack_fffffffffffffe70);
  if ((local_18[1] == -1) || (*local_18 < local_18[1])) {
    GetCurrentFunction(in_RDI);
    Instruction::ABxCode
              ((OpType)in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (int)in_stack_fffffffffffffe68);
    Function::AddInstruction
              ((Function *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (Instruction)(uint)((ulong)this_01 >> 0x20),
               (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  }
  FillRemainRegisterNil
            ((CodeGenerateVisitor *)this_01,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
             (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(FunctionBody *func_body, void *data)
    {
        int child_index = 0;
        {
            CODE_GENERATE_GUARD(EnterFunction, LeaveFunction);
            auto function = GetCurrentFunction();
            function->SetLine(func_body->line_);
            child_index = current_function_->func_index_;

            {
                CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
                // Child function generate code
                if (func_body->has_self_)
                {
                    auto register_id = GenerateRegisterId();
                    auto self = state_->GetString("self");
                    InsertName(self, register_id);

                    auto function = GetCurrentFunction();
                    function->AddFixedArgCount(1);
                }

                if (func_body->param_list_)
                    func_body->param_list_->Accept(this, nullptr);
                func_body->block_->Accept(this, nullptr);
            }
        }

        // Generate closure
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;
        if (end_register == EXP_VALUE_COUNT_ANY || register_id < end_register)
        {
            auto function = GetCurrentFunction();
            auto i = Instruction::ABxCode(OpType_Closure,
                                          register_id++,
                                          child_index);
            function->AddInstruction(i, func_body->line_);
        }

        FillRemainRegisterNil(register_id, end_register, func_body->line_);
    }